

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_asn1.cc
# Opt level: O1

EVP_PKEY_ASN1_METHOD * parse_key_type(CBS *cbs)

{
  bool bVar1;
  int iVar2;
  ulong __n;
  long lVar3;
  EVP_PKEY_ASN1_METHOD *unaff_R14;
  EVP_PKEY_ASN1_METHOD *pEVar4;
  CBS oid;
  CBS local_40;
  
  iVar2 = CBS_get_asn1(cbs,&local_40,6);
  if (iVar2 != 0) {
    lVar3 = 0;
    do {
      pEVar4 = *(EVP_PKEY_ASN1_METHOD **)((long)kASN1Methods + lVar3);
      __n = (ulong)pEVar4->oid_len;
      if ((local_40.len == __n) &&
         ((__n == 0 || (iVar2 = bcmp(local_40.data,pEVar4->oid,__n), iVar2 == 0)))) {
        bVar1 = false;
      }
      else {
        bVar1 = true;
        pEVar4 = unaff_R14;
      }
      if (!bVar1) {
        return pEVar4;
      }
      lVar3 = lVar3 + 8;
      unaff_R14 = pEVar4;
    } while (lVar3 != 0x28);
  }
  return (EVP_PKEY_ASN1_METHOD *)0x0;
}

Assistant:

static const EVP_PKEY_ASN1_METHOD *parse_key_type(CBS *cbs) {
  CBS oid;
  if (!CBS_get_asn1(cbs, &oid, CBS_ASN1_OBJECT)) {
    return NULL;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kASN1Methods); i++) {
    const EVP_PKEY_ASN1_METHOD *method = kASN1Methods[i];
    if (CBS_len(&oid) == method->oid_len &&
        OPENSSL_memcmp(CBS_data(&oid), method->oid, method->oid_len) == 0) {
      return method;
    }
  }

  return NULL;
}